

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_cross.cpp
# Opt level: O3

bool __thiscall
spirv_cross::Compiler::AnalyzeVariableScopeAccessHandler::handle_terminator
          (AnalyzeVariableScopeAccessHandler *this,SPIRBlock *block)

{
  int iVar1;
  uint32_t id;
  
  iVar1 = *(int *)&(block->super_IVariant).field_0xc;
  if (iVar1 - 2U < 2) {
    id = (block->condition).id;
  }
  else {
    if (iVar1 != 4) {
      return true;
    }
    id = (block->return_value).id;
    if (id == 0) {
      return true;
    }
  }
  notify_variable_access(this,id,(block->super_IVariant).self.id);
  return true;
}

Assistant:

bool Compiler::AnalyzeVariableScopeAccessHandler::handle_terminator(const SPIRBlock &block)
{
	switch (block.terminator)
	{
	case SPIRBlock::Return:
		if (block.return_value)
			notify_variable_access(block.return_value, block.self);
		break;

	case SPIRBlock::Select:
	case SPIRBlock::MultiSelect:
		notify_variable_access(block.condition, block.self);
		break;

	default:
		break;
	}

	return true;
}